

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O1

bool __thiscall
magic_enum::containers::
bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
          (bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
           *this,Color pos)

{
  ulong uVar1;
  ulong uVar2;
  out_of_range *this_00;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (2 < uVar2) break;
    uVar1 = uVar2 + 1;
  } while (1 << ((byte)uVar2 & 0x1f) != pos);
  if (uVar2 < 3) {
    return ((this->a)._M_elems[0] >> ((byte)((char)(uVar2 + 1) - 1) & 0x1f) & 1) != 0;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range
            (this_00,"magic_enum::containers::bitset::test: Unrecognized position");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

constexpr bool test(E pos) const {
    if (auto i = index_type::at(pos)) {
      return static_cast<bool>(const_reference(this, *i));
    }
    MAGIC_ENUM_THROW(std::out_of_range("magic_enum::containers::bitset::test: Unrecognized position"));
  }